

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraphInternal::EqualsCondition> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraphInternal::EqualsCondition>::
Bind<cmCMakePresetsGraphInternal::EqualsCondition,std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraphInternal::EqualsCondition> *this,string_view *name,
          offset_in_EqualsCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          member,function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraphInternal::EqualsCondition> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *pfStack_28;
  bool required_local;
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *func_local;
  offset_in_EqualsCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraphInternal::EqualsCondition> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                *)member;
  member_local = (offset_in_EqualsCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  )name;
  name_local = (string_view *)this;
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function(&local_78.func,func);
  local_78.member =
       (offset_in_EqualsCondition_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
        )func_local;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::EqualsCondition&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraphInternal::EqualsCondition>::Bind<cmCMakePresetsGraphInternal::EqualsCondition,std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string_cmCMakePresetsGraphInternal::EqualsCondition::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraphInternal::EqualsCondition&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::EqualsCondition&,Json::Value_const*)>
              *)&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraphInternal::EqualsCondition_&,_const_Json::Value_*)>
  ::~function(&local_50);
  Bind<cmCMakePresetsGraphInternal::EqualsCondition,std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string_cmCMakePresetsGraphInternal::EqualsCondition::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>,bool)
  ::{lambda(cmCMakePresetsGraphInternal::EqualsCondition&,Json::Value_const*)#1}::~basic_string_view
            ((_lambda_cmCMakePresetsGraphInternal__EqualsCondition__Json__Value_const___1_ *)
             &local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }